

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInformation.test.cpp
# Opt level: O2

void verifyChunk(ElementInformation *chunk)

{
  range_reference_t<D<true>_> pdVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  double local_100;
  AssertionHandler catchAssertionHandler;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
  local_78;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x6b;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x10;
  capturedExpression.m_start = "2 == chunk.NAS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_b0,capturedExpression,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       (undefined4)
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_a8._1_1_ = local_98[0]._8_4_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c72f0;
  local_a8._4_4_ = 2;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x6c;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x18;
  capturedExpression_00.m_start = "2 == chunk.numberAtoms()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_b0,capturedExpression_00,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       (undefined4)
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_a8._1_1_ = local_98[0]._8_4_ == 2;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c72f0;
  local_a8._4_4_ = 2;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x6d;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "3 == chunk.NI()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_b0,capturedExpression_01,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       *(undefined4 *)
        &(chunk->super_ListRecord).metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  local_a8._1_1_ = local_98[0]._8_4_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c72f0;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x6e;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x1b;
  capturedExpression_02.m_start = "3 == chunk.numberIsotopes()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_b0,capturedExpression_02,
             ContinueOnFailure);
  local_98[0]._8_4_ =
       *(undefined4 *)
        &(chunk->super_ListRecord).metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  local_a8._1_1_ = local_98[0]._8_4_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c72f0;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x70;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x17;
  capturedExpression_03.m_start = "3 == chunk.ZAI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_b0,capturedExpression_03,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x71;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x26;
  capturedExpression_04.m_start = "3 == chunk.isotopeIdentifiers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_b0,capturedExpression_04,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x72;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x18;
  capturedExpression_05.m_start = "3 == chunk.LISI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_b0,capturedExpression_05,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x73;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x22;
  capturedExpression_06.m_start = "3 == chunk.isomericStates().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_b0,capturedExpression_06,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x74;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x17;
  capturedExpression_07.m_start = "3 == chunk.AFI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_b0,capturedExpression_07,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x75;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1e;
  capturedExpression_08.m_start = "3 == chunk.abundances().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_b0,capturedExpression_08,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x76;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x18;
  capturedExpression_09.m_start = "3 == chunk.AWRI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_b0,capturedExpression_09,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x77;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x26;
  capturedExpression_10.m_start = "3 == chunk.atomicWeightRatios().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_b0,capturedExpression_10,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x78;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x17;
  capturedExpression_11.m_start = "3 == chunk.SFI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_b0,capturedExpression_11,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x79;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x2f;
  capturedExpression_12.m_start = "3 == chunk.freeScatteringCrossSections().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_b0,capturedExpression_12,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  local_98[0]._8_8_ =
       ((((long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current -
          (long)local_78.
                super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .
                super_stride_view_adaptor<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
                .rng_.data_.
                super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                .
                super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                ._M_head_impl._M_current >> 3) +
        local_78.
        super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
        .stride_) - 1U) /
       (ulong)local_78.
              super_stride_view_base<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
              .stride_;
  local_a8._1_1_ = local_98[0]._8_8_ == 3;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7330;
  local_a8._4_4_ = 3;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x7a;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x16;
  capturedExpression_13.m_start = "8016 == chunk.ZAI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_b0,capturedExpression_13,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8016.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8._4_4_ = 0x1f50;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x7b;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x16;
  capturedExpression_14.m_start = "8017 == chunk.ZAI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_b0,capturedExpression_14,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8017.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8._4_4_ = 0x1f51;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x7c;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x16;
  capturedExpression_15.m_start = "8018 == chunk.ZAI()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_b0,capturedExpression_15,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8018.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8._4_4_ = 0x1f52;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x7d;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x25;
  capturedExpression_16.m_start = "8016 == chunk.isotopeIdentifiers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_b0,capturedExpression_16,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8016.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8._4_4_ = 0x1f50;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x7e;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x25;
  capturedExpression_17.m_start = "8017 == chunk.isotopeIdentifiers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_b0,capturedExpression_17,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8017.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8._4_4_ = 0x1f51;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x7f;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x25;
  capturedExpression_18.m_start = "8018 == chunk.isotopeIdentifiers()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_b0,capturedExpression_18,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::ZAI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 8018.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8._4_4_ = 0x1f52;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x80;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x14;
  capturedExpression_19.m_start = "0 == chunk.LISI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_b0,capturedExpression_19,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x81;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x14;
  capturedExpression_20.m_start = "0 == chunk.LISI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_b0,capturedExpression_20,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x82;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x14;
  capturedExpression_21.m_start = "0 == chunk.LISI()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_b0,capturedExpression_21,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x83;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x1e;
  capturedExpression_22.m_start = "0 == chunk.isomericStates()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_b0,capturedExpression_22,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x84;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x1e;
  capturedExpression_23.m_start = "0 == chunk.isomericStates()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_b0,capturedExpression_23,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x85;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x1e;
  capturedExpression_24.m_start = "0 == chunk.isomericStates()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_b0,capturedExpression_24,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::LISI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  local_98[0]._8_8_ = *pdVar1;
  local_a8._1_1_ = (double)local_98[0]._8_8_ == 0.0;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c7370;
  local_a8 = local_a8 & 0xffffffff;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x86;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x28;
  capturedExpression_25.m_start = "9.976200e-1, WithinRel( chunk.AFI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_b0,capturedExpression_25,
             ContinueOnFailure);
  local_100 = 0.99762;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x87;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x28;
  capturedExpression_26.m_start = "3.800000e-4, WithinRel( chunk.AFI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_b0,capturedExpression_26,
             ContinueOnFailure);
  local_100 = 0.00038;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x88;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x28;
  capturedExpression_27.m_start = "2.000000e-3, WithinRel( chunk.AFI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_b0,capturedExpression_27,
             ContinueOnFailure);
  local_100 = 0.002;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x89;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x2f;
  capturedExpression_28.m_start = "9.976200e-1, WithinRel( chunk.abundances()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_b0,capturedExpression_28,
             ContinueOnFailure);
  local_100 = 0.99762;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x8a;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x2f;
  capturedExpression_29.m_start = "3.800000e-4, WithinRel( chunk.abundances()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_b0,capturedExpression_29,
             ContinueOnFailure);
  local_100 = 0.00038;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x8b;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x2f;
  capturedExpression_30.m_start = "2.000000e-3, WithinRel( chunk.abundances()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_30,(SourceLineInfo *)local_b0,capturedExpression_30,
             ContinueOnFailure);
  local_100 = 0.002;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x8c;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x26;
  capturedExpression_31.m_start = "15.85751, WithinRel( chunk.AWRI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_31,(SourceLineInfo *)local_b0,capturedExpression_31,
             ContinueOnFailure);
  local_100 = 15.85751;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x8d;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x26;
  capturedExpression_32.m_start = "16.85310, WithinRel( chunk.AWRI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_32,(SourceLineInfo *)local_b0,capturedExpression_32,
             ContinueOnFailure);
  local_100 = 16.8531;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x8e;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x26;
  capturedExpression_33.m_start = "17.84450, WithinRel( chunk.AWRI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_33,(SourceLineInfo *)local_b0,capturedExpression_33,
             ContinueOnFailure);
  local_100 = 17.8445;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x8f;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x34;
  capturedExpression_34.m_start = "15.85751, WithinRel( chunk.atomicWeightRatios()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_34,(SourceLineInfo *)local_b0,capturedExpression_34,
             ContinueOnFailure);
  local_100 = 15.85751;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x90;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x34;
  capturedExpression_35.m_start = "16.85310, WithinRel( chunk.atomicWeightRatios()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_35,(SourceLineInfo *)local_b0,capturedExpression_35,
             ContinueOnFailure);
  local_100 = 16.8531;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x91;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x34;
  capturedExpression_36.m_start = "17.84450, WithinRel( chunk.atomicWeightRatios()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_36,(SourceLineInfo *)local_b0,capturedExpression_36,
             ContinueOnFailure);
  local_100 = 17.8445;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::AWRI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x92;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x25;
  capturedExpression_37.m_start = "3.744801, WithinRel( chunk.SFI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_37,(SourceLineInfo *)local_b0,capturedExpression_37,
             ContinueOnFailure);
  local_100 = 3.744801;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x93;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x25;
  capturedExpression_38.m_start = "3.642671, WithinRel( chunk.SFI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_38,(SourceLineInfo *)local_b0,capturedExpression_38,
             ContinueOnFailure);
  local_100 = 3.642671;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x94;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x25;
  capturedExpression_39.m_start = "3.846775, WithinRel( chunk.SFI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_39,(SourceLineInfo *)local_b0,capturedExpression_39,
             ContinueOnFailure);
  local_100 = 3.846775;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x95;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x3d;
  capturedExpression_40.m_start = "3.744801, WithinRel( chunk.freeScatteringCrossSections()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_40,(SourceLineInfo *)local_b0,capturedExpression_40,
             ContinueOnFailure);
  local_100 = 3.744801;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x96;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x3d;
  capturedExpression_41.m_start = "3.642671, WithinRel( chunk.freeScatteringCrossSections()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_41,(SourceLineInfo *)local_b0,capturedExpression_41,
             ContinueOnFailure);
  local_100 = 3.642671;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x97;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x3d;
  capturedExpression_42.m_start = "3.846775, WithinRel( chunk.freeScatteringCrossSections()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_42,(SourceLineInfo *)local_b0,capturedExpression_42,
             ContinueOnFailure);
  local_100 = 3.846775;
  njoy::ENDFtk::section::Type<7,_451>::ElementInformation::SFI(&local_78,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)&local_78,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_b0,*pdVar1);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_b0,&local_100);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c73b0;
  local_40 = &local_100;
  local_38 = (WithinRelMatcher *)local_b0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_b0 = (undefined1  [8])0x17c478;
  local_a8 = (pointer)0x99;
  macroName_43.m_size = 5;
  macroName_43.m_start = "CHECK";
  capturedExpression_43.m_size = 0xf;
  capturedExpression_43.m_start = "4 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_43,(SourceLineInfo *)local_b0,capturedExpression_43,
             ContinueOnFailure);
  local_98[0]._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_a8._1_1_ = local_98[0]._8_8_ == 4;
  local_a8._0_1_ = true;
  local_b0 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73f0;
  local_a8._4_4_ = 4;
  local_a0 = "==";
  local_98[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_b0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const ElementInformation& chunk ) {

  CHECK( 2 == chunk.NAS() );
  CHECK( 2 == chunk.numberAtoms() );
  CHECK( 3 == chunk.NI() );
  CHECK( 3 == chunk.numberIsotopes() );

  CHECK( 3 == chunk.ZAI().size() );
  CHECK( 3 == chunk.isotopeIdentifiers().size() );
  CHECK( 3 == chunk.LISI().size() );
  CHECK( 3 == chunk.isomericStates().size() );
  CHECK( 3 == chunk.AFI().size() );
  CHECK( 3 == chunk.abundances().size() );
  CHECK( 3 == chunk.AWRI().size() );
  CHECK( 3 == chunk.atomicWeightRatios().size() );
  CHECK( 3 == chunk.SFI().size() );
  CHECK( 3 == chunk.freeScatteringCrossSections().size() );
  CHECK( 8016 == chunk.ZAI()[0] );
  CHECK( 8017 == chunk.ZAI()[1] );
  CHECK( 8018 == chunk.ZAI()[2] );
  CHECK( 8016 == chunk.isotopeIdentifiers()[0] );
  CHECK( 8017 == chunk.isotopeIdentifiers()[1] );
  CHECK( 8018 == chunk.isotopeIdentifiers()[2] );
  CHECK( 0 == chunk.LISI()[0] );
  CHECK( 0 == chunk.LISI()[1] );
  CHECK( 0 == chunk.LISI()[2] );
  CHECK( 0 == chunk.isomericStates()[0] );
  CHECK( 0 == chunk.isomericStates()[1] );
  CHECK( 0 == chunk.isomericStates()[2] );
  CHECK_THAT( 9.976200e-1, WithinRel( chunk.AFI()[0] ) );
  CHECK_THAT( 3.800000e-4, WithinRel( chunk.AFI()[1] ) );
  CHECK_THAT( 2.000000e-3, WithinRel( chunk.AFI()[2] ) );
  CHECK_THAT( 9.976200e-1, WithinRel( chunk.abundances()[0] ) );
  CHECK_THAT( 3.800000e-4, WithinRel( chunk.abundances()[1] ) );
  CHECK_THAT( 2.000000e-3, WithinRel( chunk.abundances()[2] ) );
  CHECK_THAT(    15.85751, WithinRel( chunk.AWRI()[0] ) );
  CHECK_THAT(    16.85310, WithinRel( chunk.AWRI()[1] ) );
  CHECK_THAT(    17.84450, WithinRel( chunk.AWRI()[2] ) );
  CHECK_THAT(    15.85751, WithinRel( chunk.atomicWeightRatios()[0] ) );
  CHECK_THAT(    16.85310, WithinRel( chunk.atomicWeightRatios()[1] ) );
  CHECK_THAT(    17.84450, WithinRel( chunk.atomicWeightRatios()[2] ) );
  CHECK_THAT(    3.744801, WithinRel( chunk.SFI()[0] ) );
  CHECK_THAT(    3.642671, WithinRel( chunk.SFI()[1] ) );
  CHECK_THAT(    3.846775, WithinRel( chunk.SFI()[2] ) );
  CHECK_THAT(    3.744801, WithinRel( chunk.freeScatteringCrossSections()[0] ) );
  CHECK_THAT(    3.642671, WithinRel( chunk.freeScatteringCrossSections()[1] ) );
  CHECK_THAT(    3.846775, WithinRel( chunk.freeScatteringCrossSections()[2] ) );

  CHECK( 4 == chunk.NC() );
}